

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

iterator * __thiscall
QPDFNumberTreeObjectHelper::end(iterator *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this)

{
  __shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  iterator local_88;
  QPDFNumberTreeObjectHelper *local_18;
  QPDFNumberTreeObjectHelper *this_local;
  
  local_18 = this;
  this_local = (QPDFNumberTreeObjectHelper *)__return_storage_ptr__;
  this_00 = (__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            __shared_ptr_access<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m);
  this_01 = std::__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_00);
  NNTreeImpl::end(&local_88,this_01);
  std::make_shared<NNTreeIterator,NNTreeIterator>((NNTreeIterator *)&stack0xffffffffffffffd8);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)&stack0xffffffffffffffd8);
  std::shared_ptr<NNTreeIterator>::~shared_ptr
            ((shared_ptr<NNTreeIterator> *)&stack0xffffffffffffffd8);
  NNTreeIterator::~NNTreeIterator(&local_88);
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator
QPDFNumberTreeObjectHelper::end() const
{
    return {std::make_shared<NNTreeIterator>(m->impl->end())};
}